

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

Store * __thiscall
wasm::Builder::makeStore
          (Builder *this,uint bytes,Address offset,uint align,Expression *ptr,Expression *value,
          Type type,Name memory)

{
  Store *this_00;
  
  this_00 = (Store *)MixedArena::allocSpace(&this->wasm->allocator,0x58,8);
  *(undefined8 *)&(this_00->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression = 0
  ;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
  (this_00->align).addr = 0;
  *(undefined8 *)&this_00->isAtomic = 0;
  *(undefined8 *)&this_00->bytes = 0;
  (this_00->offset).addr = 0;
  this_00->ptr = (Expression *)0x0;
  this_00->value = (Expression *)0x0;
  (this_00->valueType).id = 0;
  (this_00->memory).super_IString.str._M_len = 0;
  (this_00->memory).super_IString.str._M_str = (char *)0x0;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
  (this_00->offset).addr = 0;
  (this_00->align).addr = 0;
  this_00->isAtomic = false;
  this_00->bytes = (uint8_t)bytes;
  (this_00->offset).addr = offset.addr;
  (this_00->align).addr = (ulong)align;
  this_00->ptr = ptr;
  this_00->value = value;
  (this_00->valueType).id = type.id;
  (this_00->memory).super_IString.str._M_len = memory.super_IString.str._M_len;
  (this_00->memory).super_IString.str._M_str = memory.super_IString.str._M_str;
  Store::finalize(this_00);
  return this_00;
}

Assistant:

Store* makeStore(unsigned bytes,
                   Address offset,
                   unsigned align,
                   Expression* ptr,
                   Expression* value,
                   Type type,
                   Name memory) {
    auto* ret = wasm.allocator.alloc<Store>();
    ret->isAtomic = false;
    ret->bytes = bytes;
    ret->offset = offset;
    ret->align = align;
    ret->ptr = ptr;
    ret->value = value;
    ret->valueType = type;
    ret->memory = memory;
    ret->finalize();
    return ret;
  }